

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O1

void CheckFunction(LlvmCompilationContext *ctx,LLVMValueRef function,InplaceStr name)

{
  return;
}

Assistant:

void CheckFunction(LlvmCompilationContext &ctx, LLVMValueRef function, InplaceStr name)
{
	(void)ctx;
	(void)function;
	(void)name;

#if !defined(NDEBUG)
	// Check result
	if(LLVMVerifyFunction(function, LLVMReturnStatusAction))
	{
		LLVMDumpValue(function);

		printf("LLVM function '%.*s' verification failed\n", name.length(), name.begin);

		char *error = NULL;

		if(LLVMVerifyModule(ctx.module, LLVMReturnStatusAction, &error))
			printf("%s\n", error);

		LLVMDisposeMessage(error);
	}
#endif
}